

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<long_double>_>::MultiplyByScalar
          (TPZMatrix<Fad<long_double>_> *this,Fad<long_double> *alpha,
          TPZMatrix<Fad<long_double>_> *res)

{
  Fad<long_double> FStack_d8;
  TPZFMatrixRef<Fad<long_double>_> local_a8;
  
  (*(res->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1f])(res,this);
  Fad<long_double>::Fad(&FStack_d8,alpha);
  Storage(&local_a8,res);
  TPZFMatrix<Fad<long_double>_>::operator*=
            (&local_a8.super_TPZFMatrix<Fad<long_double>_>,&FStack_d8);
  TPZFMatrixRef<Fad<long_double>_>::~TPZFMatrixRef(&local_a8);
  Fad<long_double>::~Fad(&FStack_d8);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultiplyByScalar(const TVar alpha, TPZMatrix<TVar>&res) const
{
  res.CopyFrom(this);
  res.Storage() *= alpha;
}